

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

uhugeint_t
duckdb::TryCastCInternal<duckdb::hugeint_t,duckdb::uhugeint_t,duckdb::TryCast>
          (duckdb_result *result,idx_t col,idx_t row)

{
  void *pvVar1;
  bool bVar2;
  bool in_R8B;
  hugeint_t input;
  uhugeint_t result_value;
  uhugeint_t local_20;
  
  pvVar1 = result->deprecated_columns[col].deprecated_data;
  input.upper = (int64_t)&local_20;
  input.lower = *(uint64_t *)((long)pvVar1 + row * 0x10 + 8);
  bVar2 = TryCast::Operation<duckdb::hugeint_t,duckdb::uhugeint_t>
                    (*(TryCast **)((long)pvVar1 + row * 0x10),input,(uhugeint_t *)0x0,in_R8B);
  if (!bVar2) {
    local_20 = FetchDefaultValue::Operation<duckdb::uhugeint_t>();
  }
  return local_20;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}